

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_add_rel_pos_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *pw,ggml_tensor *ph,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  
  _Var1 = ggml_are_same_shape(pw,ph);
  if (_Var1) {
    _Var1 = ggml_is_contiguous_0(a);
    if (_Var1) {
      _Var1 = ggml_is_contiguous_0(pw);
      if (_Var1) {
        _Var1 = ggml_is_contiguous_0(ph);
        if (_Var1) {
          if (ph->type == GGML_TYPE_F32) {
            if (pw->type == GGML_TYPE_F32) {
              if (pw->ne[3] == a->ne[2]) {
                if (pw->ne[0] * pw->ne[0] - a->ne[0] == 0) {
                  if (pw->ne[2] * pw->ne[1] - a->ne[1] == 0) {
                    if (inplace) {
                      pgVar2 = ggml_view_tensor(ctx,a);
                    }
                    else {
                      pgVar2 = ggml_dup_tensor(ctx,a);
                    }
                    pgVar2->op_params[0] = (uint)inplace;
                    pgVar2->op = GGML_OP_ADD_REL_POS;
                    pgVar2->src[0] = a;
                    pgVar2->src[1] = pw;
                    pgVar2->src[2] = ph;
                    return pgVar2;
                  }
                  pcVar3 = "pw->ne[1]*pw->ne[2] == a->ne[1]";
                  line = 0x1255;
                }
                else {
                  pcVar3 = "pw->ne[0]*pw->ne[0] == a->ne[0]";
                  line = 0x1254;
                }
              }
              else {
                pcVar3 = "pw->ne[3] == a->ne[2]";
                line = 0x1253;
              }
            }
            else {
              pcVar3 = "pw->type == GGML_TYPE_F32";
              line = 0x1252;
            }
          }
          else {
            pcVar3 = "ph->type == GGML_TYPE_F32";
            line = 0x1251;
          }
        }
        else {
          pcVar3 = "ggml_is_contiguous(ph)";
          line = 0x1250;
        }
      }
      else {
        pcVar3 = "ggml_is_contiguous(pw)";
        line = 0x124f;
      }
    }
    else {
      pcVar3 = "ggml_is_contiguous(a)";
      line = 0x124e;
    }
  }
  else {
    pcVar3 = "ggml_are_same_shape(pw, ph)";
    line = 0x124d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

static struct ggml_tensor * ggml_add_rel_pos_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * pw,
        struct ggml_tensor  * ph,
        bool                  inplace) {
    GGML_ASSERT(ggml_are_same_shape(pw, ph));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(pw));
    GGML_ASSERT(ggml_is_contiguous(ph));
    GGML_ASSERT(ph->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->ne[3] == a->ne[2]);
    GGML_ASSERT(pw->ne[0]*pw->ne[0] == a->ne[0]);
    GGML_ASSERT(pw->ne[1]*pw->ne[2] == a->ne[1]);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    ggml_set_op_params_i32(result, 0, inplace ? 1 : 0);

    result->op     = GGML_OP_ADD_REL_POS;
    result->src[0] = a;
    result->src[1] = pw;
    result->src[2] = ph;

    return result;
}